

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalPdu.cpp
# Opt level: O3

void __thiscall DIS::SignalPdu::unmarshal(SignalPdu *this,DataStream *dataStream)

{
  pointer *ppuVar1;
  ushort uVar2;
  pointer puVar3;
  iterator __position;
  uint uVar4;
  uint8_t x;
  uchar local_29;
  
  RadioCommunicationsFamilyPdu::unmarshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  DataStream::operator>>
            (dataStream,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2a);
  DataStream::operator>>
            (dataStream,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2c);
  DataStream::operator>>(dataStream,&this->_sampleRate);
  DataStream::operator>>(dataStream,&this->_dataLength);
  DataStream::operator>>(dataStream,&this->_samples);
  puVar3 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  uVar2 = this->_dataLength;
  if (0 < (short)uVar2) {
    uVar4 = uVar2 + 7 >> 3;
    do {
      DataStream::operator>>(dataStream,&local_29);
      __position._M_current =
           (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->_data,__position,
                   &local_29);
      }
      else {
        *__position._M_current = local_29;
        ppuVar1 = &(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void SignalPdu::unmarshal(DataStream &dataStream)
{
  RadioCommunicationsFamilyPdu::unmarshal(
      dataStream); // unmarshal information in superclass first
  dataStream >> _encodingScheme;
  dataStream >> _tdlType;
  dataStream >> _sampleRate;
  dataStream >> _dataLength;
  dataStream >> _samples;

  _data.clear();
  const int dataLengthBytes = (_dataLength + 7) / 8; // bits to bytes
  for (auto idx = 0; idx < dataLengthBytes; ++idx)
  {
    uint8_t x;
    dataStream >> x;
    _data.push_back(x);
  }
}